

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_dstore_2(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value VVar1;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  if (VVar1.type != DOUBLE) {
    __assert_fail("value.type == ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x5bc,"void ExecutionEngine::i_dstore_2()");
  }
  Frame::changeLocalVariable(this_01,VVar1,2);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  if ((VVar1._0_8_ & 0xffffffff00000000) == 0xa00000000) {
    Frame::changeLocalVariable(this_01,VVar1,3);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::PADDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x5c0,"void ExecutionEngine::i_dstore_2()");
}

Assistant:

void ExecutionEngine::i_dstore_2() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::DOUBLE);
    topFrame->changeLocalVariable(value, 2);

    value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::PADDING);
    topFrame->changeLocalVariable(value, 3);

    topFrame->pc += 1;
}